

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGValidateDefinition(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define)

{
  int iVar1;
  xmlGenericErrorFunc p_Var2;
  xmlRelaxNGStatesPtr states_00;
  int iVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  int local_40;
  int oldflags;
  int ret;
  int k;
  int j;
  int i;
  xmlRelaxNGStatesPtr res;
  xmlRelaxNGStatesPtr states;
  xmlRelaxNGDefinePtr_conflict define_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  if ((ctxt->state != (xmlRelaxNGValidStatePtr)0x0) && (ctxt->states != (xmlRelaxNGStatesPtr)0x0)) {
    pp_Var4 = __xmlGenericError();
    p_Var2 = *pp_Var4;
    ppvVar5 = __xmlGenericErrorContext();
    (*p_Var2)(*ppvVar5,"Unimplemented block at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/relaxng.c"
              ,0x29a0);
    xmlRelaxNGFreeValidState(ctxt,ctxt->state);
    ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
  }
  if ((ctxt->states == (xmlRelaxNGStatesPtr)0x0) || (ctxt->states->nbState == 1)) {
    if (ctxt->states != (xmlRelaxNGStatesPtr)0x0) {
      ctxt->state = *ctxt->states->tabState;
      xmlRelaxNGFreeStates(ctxt,ctxt->states);
      ctxt->states = (xmlRelaxNGStatesPtr)0x0;
    }
    ctxt_local._4_4_ = xmlRelaxNGValidateState(ctxt,define);
    if ((ctxt->state != (xmlRelaxNGValidStatePtr)0x0) && (ctxt->states != (xmlRelaxNGStatesPtr)0x0))
    {
      pp_Var4 = __xmlGenericError();
      p_Var2 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      (*p_Var2)(*ppvVar5,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/relaxng.c"
                ,0x29ac);
      xmlRelaxNGFreeValidState(ctxt,ctxt->state);
      ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
    }
    if ((ctxt->states != (xmlRelaxNGStatesPtr)0x0) && (ctxt->states->nbState == 1)) {
      ctxt->state = *ctxt->states->tabState;
      xmlRelaxNGFreeStates(ctxt,ctxt->states);
      ctxt->states = (xmlRelaxNGStatesPtr)0x0;
    }
  }
  else {
    states_00 = ctxt->states;
    ctxt->states = (xmlRelaxNGStatesPtr)0x0;
    _j = (xmlRelaxNGStatesPtr)0x0;
    ret = 0;
    iVar1 = ctxt->flags;
    ctxt->flags = ctxt->flags | 1;
    for (k = 0; k < states_00->nbState; k = k + 1) {
      ctxt->state = states_00->tabState[k];
      ctxt->states = (xmlRelaxNGStatesPtr)0x0;
      iVar3 = xmlRelaxNGValidateState(ctxt,define);
      if ((ctxt->state != (xmlRelaxNGValidStatePtr)0x0) &&
         (ctxt->states != (xmlRelaxNGStatesPtr)0x0)) {
        pp_Var4 = __xmlGenericError();
        p_Var2 = *pp_Var4;
        ppvVar5 = __xmlGenericErrorContext();
        (*p_Var2)(*ppvVar5,"Unimplemented block at %s:%d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/relaxng.c"
                  ,0x29c5);
        xmlRelaxNGFreeValidState(ctxt,ctxt->state);
        ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
      }
      if (iVar3 == 0) {
        if (ctxt->states == (xmlRelaxNGStatesPtr)0x0) {
          if (_j == (xmlRelaxNGStatesPtr)0x0) {
            states_00->tabState[ret] = ctxt->state;
            ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
            ret = ret + 1;
          }
          else {
            xmlRelaxNGAddStates(ctxt,_j,ctxt->state);
            ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
          }
        }
        else if (_j == (xmlRelaxNGStatesPtr)0x0) {
          _j = ctxt->states;
          ctxt->states = (xmlRelaxNGStatesPtr)0x0;
          for (oldflags = 0; oldflags < ret; oldflags = oldflags + 1) {
            xmlRelaxNGAddStates(ctxt,_j,states_00->tabState[oldflags]);
          }
        }
        else {
          for (oldflags = 0; oldflags < ctxt->states->nbState; oldflags = oldflags + 1) {
            xmlRelaxNGAddStates(ctxt,_j,ctxt->states->tabState[oldflags]);
          }
          xmlRelaxNGFreeStates(ctxt,ctxt->states);
          ctxt->states = (xmlRelaxNGStatesPtr)0x0;
        }
      }
      else if (ctxt->state == (xmlRelaxNGValidStatePtr)0x0) {
        if (ctxt->states != (xmlRelaxNGStatesPtr)0x0) {
          for (oldflags = 0; oldflags < ctxt->states->nbState; oldflags = oldflags + 1) {
            xmlRelaxNGFreeValidState(ctxt,ctxt->states->tabState[oldflags]);
          }
          xmlRelaxNGFreeStates(ctxt,ctxt->states);
          ctxt->states = (xmlRelaxNGStatesPtr)0x0;
        }
      }
      else {
        xmlRelaxNGFreeValidState(ctxt,ctxt->state);
        ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
      }
    }
    ctxt->flags = iVar1;
    if (_j == (xmlRelaxNGStatesPtr)0x0) {
      if (ret < 2) {
        if (ret == 1) {
          ctxt->state = *states_00->tabState;
          xmlRelaxNGFreeStates(ctxt,states_00);
          local_40 = 0;
        }
        else {
          local_40 = -1;
          xmlRelaxNGFreeStates(ctxt,states_00);
          if (ctxt->states != (xmlRelaxNGStatesPtr)0x0) {
            xmlRelaxNGFreeStates(ctxt,ctxt->states);
            ctxt->states = (xmlRelaxNGStatesPtr)0x0;
          }
        }
      }
      else {
        states_00->nbState = ret;
        ctxt->states = states_00;
        local_40 = 0;
      }
    }
    else {
      xmlRelaxNGFreeStates(ctxt,states_00);
      ctxt->states = _j;
      local_40 = 0;
    }
    if ((ctxt->state != (xmlRelaxNGValidStatePtr)0x0) && (ctxt->states != (xmlRelaxNGStatesPtr)0x0))
    {
      pp_Var4 = __xmlGenericError();
      p_Var2 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      (*p_Var2)(*ppvVar5,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/relaxng.c"
                ,0x2a07);
      xmlRelaxNGFreeValidState(ctxt,ctxt->state);
      ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
    }
    ctxt_local._4_4_ = local_40;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlRelaxNGValidateDefinition(xmlRelaxNGValidCtxtPtr ctxt,
                             xmlRelaxNGDefinePtr define)
{
    xmlRelaxNGStatesPtr states, res;
    int i, j, k, ret, oldflags;

    /*
     * We should NOT have both ctxt->state and ctxt->states
     */
    if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
        TODO xmlRelaxNGFreeValidState(ctxt, ctxt->state);
        ctxt->state = NULL;
    }

    if ((ctxt->states == NULL) || (ctxt->states->nbState == 1)) {
        if (ctxt->states != NULL) {
            ctxt->state = ctxt->states->tabState[0];
            xmlRelaxNGFreeStates(ctxt, ctxt->states);
            ctxt->states = NULL;
        }
        ret = xmlRelaxNGValidateState(ctxt, define);
        if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
            TODO xmlRelaxNGFreeValidState(ctxt, ctxt->state);
            ctxt->state = NULL;
        }
        if ((ctxt->states != NULL) && (ctxt->states->nbState == 1)) {
            ctxt->state = ctxt->states->tabState[0];
            xmlRelaxNGFreeStates(ctxt, ctxt->states);
            ctxt->states = NULL;
        }
        return (ret);
    }

    states = ctxt->states;
    ctxt->states = NULL;
    res = NULL;
    j = 0;
    oldflags = ctxt->flags;
    ctxt->flags |= FLAGS_IGNORABLE;
    for (i = 0; i < states->nbState; i++) {
        ctxt->state = states->tabState[i];
        ctxt->states = NULL;
        ret = xmlRelaxNGValidateState(ctxt, define);
        /*
         * We should NOT have both ctxt->state and ctxt->states
         */
        if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
            TODO xmlRelaxNGFreeValidState(ctxt, ctxt->state);
            ctxt->state = NULL;
        }
        if (ret == 0) {
            if (ctxt->states == NULL) {
                if (res != NULL) {
                    /* add the state to the container */
                    xmlRelaxNGAddStates(ctxt, res, ctxt->state);
                    ctxt->state = NULL;
                } else {
                    /* add the state directly in states */
                    states->tabState[j++] = ctxt->state;
                    ctxt->state = NULL;
                }
            } else {
                if (res == NULL) {
                    /* make it the new container and copy other results */
                    res = ctxt->states;
                    ctxt->states = NULL;
                    for (k = 0; k < j; k++)
                        xmlRelaxNGAddStates(ctxt, res,
                                            states->tabState[k]);
                } else {
                    /* add all the new results to res and reff the container */
                    for (k = 0; k < ctxt->states->nbState; k++)
                        xmlRelaxNGAddStates(ctxt, res,
                                            ctxt->states->tabState[k]);
                    xmlRelaxNGFreeStates(ctxt, ctxt->states);
                    ctxt->states = NULL;
                }
            }
        } else {
            if (ctxt->state != NULL) {
                xmlRelaxNGFreeValidState(ctxt, ctxt->state);
                ctxt->state = NULL;
            } else if (ctxt->states != NULL) {
                for (k = 0; k < ctxt->states->nbState; k++)
                    xmlRelaxNGFreeValidState(ctxt,
                                             ctxt->states->tabState[k]);
                xmlRelaxNGFreeStates(ctxt, ctxt->states);
                ctxt->states = NULL;
            }
        }
    }
    ctxt->flags = oldflags;
    if (res != NULL) {
        xmlRelaxNGFreeStates(ctxt, states);
        ctxt->states = res;
        ret = 0;
    } else if (j > 1) {
        states->nbState = j;
        ctxt->states = states;
        ret = 0;
    } else if (j == 1) {
        ctxt->state = states->tabState[0];
        xmlRelaxNGFreeStates(ctxt, states);
        ret = 0;
    } else {
        ret = -1;
        xmlRelaxNGFreeStates(ctxt, states);
        if (ctxt->states != NULL) {
            xmlRelaxNGFreeStates(ctxt, ctxt->states);
            ctxt->states = NULL;
        }
    }
    if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
        TODO xmlRelaxNGFreeValidState(ctxt, ctxt->state);
        ctxt->state = NULL;
    }
    return (ret);
}